

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     unguarded_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__3>
               (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                begin,__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                      end,anon_class_8_1_d757357c comp)

{
  bool bVar1;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  *this;
  T tmp;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  sift_1;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  sift;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  cur;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  reference in_stack_ffffffffffffff78;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  local_68 [3];
  liftingdata *in_stack_ffffffffffffffb0;
  liftingdata *in_stack_ffffffffffffffb8;
  anon_class_8_1_d757357c *in_stack_ffffffffffffffc0;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  local_30;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  local_28;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  local_20 [4];
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                      *)in_stack_ffffffffffffff68);
  if (!bVar1) {
    local_20[0] = __gnu_cxx::
                  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                  ::operator+((__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                               *)in_stack_ffffffffffffff78,
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      local_28._M_current = local_20[0]._M_current;
      local_30 = __gnu_cxx::
                 __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                 ::operator-((__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                              *)in_stack_ffffffffffffff78,
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      __gnu_cxx::
      __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
      ::operator*(&local_28);
      __gnu_cxx::
      __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
      ::operator*(&local_30);
      bVar1 = presolve::HPresolve::liftingForProbing::anon_class_8_1_d757357c::operator()
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
        ::operator*(&local_28);
        std::
        tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ::tuple((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                in_stack_ffffffffffffff68);
        do {
          in_stack_ffffffffffffff78 =
               __gnu_cxx::
               __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
               ::operator*(&local_30);
          local_68[0] = __gnu_cxx::
                        __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                        ::operator--((__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                                      *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
          __gnu_cxx::
          __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
          ::operator*(local_68);
          std::
          tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          ::operator=((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
          this = __gnu_cxx::
                 __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                 ::operator--(&local_30);
          __gnu_cxx::
          __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
          ::operator*(this);
          bVar1 = presolve::HPresolve::liftingForProbing::anon_class_8_1_d757357c::operator()
                            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             in_stack_ffffffffffffffb0);
          in_stack_ffffffffffffff74 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff74);
        } while (bVar1);
        __gnu_cxx::
        __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
        ::operator*(&local_28);
        std::
        tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ::operator=((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                     *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff68);
        std::
        tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ::~tuple((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  *)0x71923c);
      }
      __gnu_cxx::
      __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
      ::operator++(local_20);
    }
  }
  return;
}

Assistant:

inline void unguarded_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }